

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
supermap::BST<supermap::Key<2UL>,_unsigned_long,_unsigned_long>::getValue
          (BST<supermap::Key<2UL>,_unsigned_long,_unsigned_long> *this,Key<2UL> *key)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  optional<unsigned_long> *in_RDI;
  optional<unsigned_long> oVar3;
  map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
  *unaff_retaddr;
  map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28 [3];
  _Storage<unsigned_long,_true> local_10;
  undefined1 in_stack_fffffffffffffff8;
  undefined7 in_stack_fffffffffffffff9;
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x1bff96);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar2 = extraout_RDX;
  }
  else {
    std::
    map<supermap::Key<2UL>,_unsigned_long,_std::less<supermap::Key<2UL>_>,_std::allocator<std::pair<const_supermap::Key<2UL>,_unsigned_long>_>_>
    ::operator[](unaff_retaddr,
                 (key_type *)CONCAT71(in_stack_fffffffffffffff9,in_stack_fffffffffffffff8));
    std::optional<unsigned_long>::optional<unsigned_long_&,_true>
              (in_RDI,(unsigned_long *)in_stack_ffffffffffffffb8);
    uVar2 = extraout_RDX_00;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)in_stack_fffffffffffffff8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<Value> getValue(const Key &key) override {
        if (map_.find(key) == map_.end()) {
            return std::nullopt;
        }
        return std::optional{map_[key]};
    }